

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

RGB colorOfPoint(Point *point,Triangle *triangle)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  uVar2 = (triangle->x).x;
  uVar6 = (triangle->x).y;
  fVar14 = (triangle->x).z;
  uVar3 = (triangle->y).x;
  uVar7 = (triangle->y).y;
  fVar13 = (triangle->y).z;
  uVar4 = (triangle->z).x;
  uVar8 = (triangle->z).y;
  fVar1 = (triangle->z).z;
  fVar20 = point->z - fVar13;
  fVar17 = ((float)uVar7 - (float)uVar6) * (fVar1 - fVar14) -
           (fVar13 - fVar14) * ((float)uVar8 - (float)uVar6);
  fVar16 = (fVar13 - fVar14) * ((float)uVar4 - (float)uVar2) -
           (fVar1 - fVar14) * ((float)uVar3 - (float)uVar2);
  uVar5 = point->x;
  uVar9 = point->y;
  fVar18 = ((float)uVar8 - (float)uVar6) * ((float)uVar3 - (float)uVar2) -
           ((float)uVar4 - (float)uVar2) * ((float)uVar7 - (float)uVar6);
  fVar15 = point->z - fVar1;
  fVar19 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  uVar10._0_1_ = (triangle->colorX).r;
  uVar10._1_1_ = (triangle->colorX).g;
  fVar13 = ((((float)uVar9 - (float)uVar7) * ((float)uVar4 - (float)uVar3) -
            ((float)uVar5 - (float)uVar3) * ((float)uVar8 - (float)uVar7)) * fVar18 +
           (((float)uVar8 - (float)uVar7) * fVar20 -
           (fVar1 - fVar13) * ((float)uVar9 - (float)uVar7)) * fVar17 +
           ((fVar1 - fVar13) * ((float)uVar5 - (float)uVar3) -
           fVar20 * ((float)uVar4 - (float)uVar3)) * fVar16) / fVar19;
  uVar11._0_1_ = (triangle->colorY).r;
  uVar11._1_1_ = (triangle->colorY).g;
  fVar19 = ((((float)uVar9 - (float)uVar8) * ((float)uVar2 - (float)uVar4) -
            ((float)uVar5 - (float)uVar4) * ((float)uVar6 - (float)uVar8)) * fVar18 +
           (((float)uVar6 - (float)uVar8) * fVar15 -
           (fVar14 - fVar1) * ((float)uVar9 - (float)uVar8)) * fVar17 +
           ((fVar14 - fVar1) * ((float)uVar5 - (float)uVar4) -
           fVar15 * ((float)uVar2 - (float)uVar4)) * fVar16) / fVar19;
  uVar12._0_1_ = (triangle->colorZ).r;
  uVar12._1_1_ = (triangle->colorZ).g;
  fVar14 = (1.0 - fVar13) - fVar19;
  return (RGB)((uint3)(byte)((char)(int)((float)(uVar12 & 0xff) * fVar14) +
                            (char)(int)((float)(uVar11 & 0xff) * fVar19) +
                            (char)(int)((float)(uVar10 & 0xff) * fVar13)) |
              (uint3)(byte)((char)(int)((float)(uVar12 >> 8) * fVar14) +
                           (char)(int)((float)(uVar11 >> 8) * fVar19) +
                           (char)(int)((float)(uVar10 >> 8) * fVar13)) << 8 |
              (uint3)(byte)((char)(int)((float)(triangle->colorZ).b * fVar14) +
                           (char)(int)((float)(triangle->colorY).b * fVar19) +
                           (char)(int)((float)(triangle->colorX).b * fVar13)) << 0x10);
}

Assistant:

RGB colorOfPoint(Point const& point, Triangle const& triangle)
{
  float u;
  float v;

  Point v0 = triangle.x;
  Point v1 = triangle.y;
  Point v2 = triangle.z;

  Vector v0v1 = v1 - v0;
  Vector v0v2 = v2 - v0;

  Vector N = crossProduct(v0v1, v0v2);
  float denom = dotProduct(N, N);

  Vector C;

  Vector edge1 = v2 - v1;
  Vector vp1 = point - v1;
  C = crossProduct(edge1, vp1);
  u = dotProduct(N, C);

  Vector edge2 = v0 - v2;
  Vector vp2 = point - v2;
  C = crossProduct(edge2, vp2);
  v = dotProduct(N, C);

  u /= denom;
  v /= denom;

  return triangle.colorX * u + triangle.colorY * v + triangle.colorZ * (1 - u - v);
}